

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var * __thiscall cs::runtime_type::parse_dot_lhs(runtime_type *this,var *a,token_base *b)

{
  bool bVar1;
  constant_values *pcVar2;
  callable *this_00;
  undefined8 uVar3;
  token_id *in_RDX;
  var_id *in_RDI;
  string *str;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *cmap;
  var *val_1;
  var *val;
  var_id *in_stack_fffffffffffffdf8;
  domain_manager *in_stack_fffffffffffffe00;
  domain_manager *in_stack_fffffffffffffe08;
  type_info *in_stack_fffffffffffffe10;
  any *in_stack_fffffffffffffe40;
  allocator *paVar4;
  var_id *in_stack_fffffffffffffe48;
  type_t *in_stack_fffffffffffffe50;
  any *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  structure *in_stack_fffffffffffffec0;
  allocator local_b1;
  string local_b0 [32];
  var *local_90;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  var *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  token_id *local_20;
  var *local_8;
  
  local_20 = in_RDX;
  cs_impl::any::type((any *)in_stack_fffffffffffffe00);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffe10,(type_info *)in_stack_fffffffffffffe08);
  if (bVar1) {
    pcVar2 = cs_impl::any::const_val<cs::constant_values>(in_stack_fffffffffffffe80);
    if (*pcVar2 == local_namepace) {
      token_id::get_id(local_20);
      local_8 = domain_manager::get_var_current<cs::var_id_const&>
                          (in_stack_fffffffffffffe08,(var_id *)in_stack_fffffffffffffe00);
    }
    else {
      if (*pcVar2 != global_namespace) {
        local_55 = 1;
        uVar3 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"Unknown scope tag.",&local_41);
        runtime_error::runtime_error
                  ((runtime_error *)in_stack_fffffffffffffe00,(string *)in_stack_fffffffffffffdf8);
        local_55 = 0;
        __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      token_id::get_id(local_20);
      local_8 = domain_manager::get_var_global<cs::var_id_const&>
                          (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffe00);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffe10,(type_info *)in_stack_fffffffffffffe08);
    if (bVar1) {
      cs_impl::any::val<std::shared_ptr<cs::name_space>>
                ((any *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x154ecd);
      token_id::get_id(local_20);
      local_8 = name_space::get_var((name_space *)in_stack_fffffffffffffe00,
                                    in_stack_fffffffffffffdf8);
    }
    else {
      cs_impl::any::type((any *)in_stack_fffffffffffffe00);
      bVar1 = std::type_info::operator==
                        (in_stack_fffffffffffffe10,(type_info *)in_stack_fffffffffffffe08);
      if (bVar1) {
        cs_impl::any::const_val<cs::type_t>(in_stack_fffffffffffffe80);
        token_id::get_id(local_20);
        local_8 = type_t::get_var<cs::var_id_const&>
                            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
      else {
        cs_impl::any::type((any *)in_stack_fffffffffffffe00);
        bVar1 = std::type_info::operator==
                          (in_stack_fffffffffffffe10,(type_info *)in_stack_fffffffffffffe08);
        if (bVar1) {
          cs_impl::any::val<cs::structure>
                    ((any *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          token_id::get_id(local_20);
          local_60 = structure::get_var<cs::var_id_const&>(in_stack_fffffffffffffec0,in_RDI);
          cs_impl::any::type((any *)in_stack_fffffffffffffe00);
          bVar1 = std::type_info::operator!=
                            ((type_info *)in_stack_fffffffffffffe00,
                             (type_info *)in_stack_fffffffffffffdf8);
          if (!bVar1) {
            this_00 = cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffe80);
            bVar1 = callable::is_member_fn(this_00);
            if (bVar1) {
              local_82 = 1;
              uVar3 = __cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_80,"Can not visit member function as lvalue.",&local_81);
              runtime_error::runtime_error
                        ((runtime_error *)in_stack_fffffffffffffe00,
                         (string *)in_stack_fffffffffffffdf8);
              local_82 = 0;
              __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
            }
          }
          local_8 = local_60;
        }
        else {
          cs_impl::any::get_ext(in_stack_fffffffffffffe40);
          std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x155105);
          token_id::get_id(local_20);
          local_90 = name_space::get_var((name_space *)in_stack_fffffffffffffe00,
                                         in_stack_fffffffffffffdf8);
          cs_impl::any::type((any *)in_stack_fffffffffffffe00);
          bVar1 = std::type_info::operator==
                            (in_stack_fffffffffffffe10,(type_info *)in_stack_fffffffffffffe08);
          if (bVar1) {
            uVar3 = __cxa_allocate_exception(0x28);
            paVar4 = &local_b1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_b0,"Can not visit member function as lvalue.",paVar4)
            ;
            runtime_error::runtime_error
                      ((runtime_error *)in_stack_fffffffffffffe00,
                       (string *)in_stack_fffffffffffffdf8);
            __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
          }
          local_8 = local_90;
        }
      }
    }
  }
  return local_8;
}

Assistant:

var &runtime_type::parse_dot_lhs(const var &a, token_base *b)
	{
		if (a.type() == typeid(constant_values)) {
			switch (a.const_val<constant_values>()) {
			case constant_values::global_namespace:
				return storage.get_var_global(static_cast<token_id *>(b)->get_id());
			case constant_values::local_namepace:
				return storage.get_var_current(static_cast<token_id *>(b)->get_id());
			default:
				throw runtime_error("Unknown scope tag.");
			}
		}
		else if (a.type() == typeid(namespace_t))
			return a.val<namespace_t>()->get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(type_t))
			return a.const_val<type_t>().get_var(static_cast<token_id *>(b)->get_id());
		else if (a.type() == typeid(structure)) {
			var &val = a.val<structure>().get_var(static_cast<token_id *>(b)->get_id());
			if (val.type() != typeid(callable) || !val.const_val<callable>().is_member_fn())
				return val;
			else
				throw runtime_error("Can not visit member function as lvalue.");
		}
		else {
			try {
				var &val = a.get_ext()->get_var(static_cast<token_id *>(b)->get_id());
				if (val.type() == typeid(callable))
					throw runtime_error("Can not visit member function as lvalue.");
				else
					return val;
			}
			catch (...) {
				if (a.type() == typeid(hash_map)) {
					auto &cmap = a.val<hash_map>();
					const string &str = static_cast<token_id *>(b)->get_id().get_id();
					if (cmap.count(str) == 0)
						throw runtime_error(std::string("Key \"") + str + "\" does not exist.");
					return cmap.at(str);
				}
				else
					throw;
			}
		}
	}